

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

int __thiscall IrSim::ast2ic(IrSim *this,ast *node)

{
  int iVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  
  if (node == (ast *)0x0) {
    iVar1 = 0;
  }
  else {
    switch(node->type) {
    case 0x106:
      iVar1 = 5;
      break;
    case 0x107:
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char*const>>
                        (relOp_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         relOp_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&node->lex);
      iVar1 = (int)((ulong)((long)_Var2._M_current -
                           (long)relOp_abi_cxx11_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) + 0x14;
      break;
    case 0x108:
      iVar1 = 1;
      break;
    case 0x109:
      iVar1 = 2;
      break;
    case 0x10a:
      iVar1 = 3;
      break;
    case 0x10b:
      iVar1 = 4;
      break;
    case 0x10c:
      iVar1 = 0x1a;
      break;
    case 0x10d:
      iVar1 = 0x1b;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                    ,0xd2,"int IrSim::ast2ic(ast *) const");
    case 0x118:
      iVar1 = 0xb;
    }
  }
  return iVar1;
}

Assistant:

int IrSim::ast2ic(ast *node) const {
    if (!node)         return IR_NONE;
    switch (node->type) {
        case RETURN:   return IC_RETURN;
        case ASSIGNOP: return IC_ASSIGN;
        case PLUS:     return IC_ADD;
        case MINUS:    return IC_SUB;
        case STAR:     return IC_MUL;
        case DIV:      return IC_DIV;
        case AND:      return IC_AND;
        case OR:       return IC_OR;
        case RELOP:    return IC_RELOP + (find(relOp.begin(), relOp.end(), node->lex) - relOp.begin());
        default:       assert(false);
    }
}